

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_leaf_add_leafref_target(lys_node_leaf *leafref_target,lys_node *leafref)

{
  lys_node_leaf *plVar1;
  ly_set *plVar2;
  char *pcVar3;
  char *pcVar4;
  LY_ERR *pLVar5;
  int iVar6;
  
  if ((leafref_target->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
           ,0xe90);
LAB_0015a794:
    iVar6 = -1;
  }
  else {
    if (((*(char *)&leafref[1].child != -1) && ((leafref->flags & 1) != 0)) &&
       ((leafref_target->flags & 2) != 0)) {
      pcVar3 = strnodetype(leafref->nodetype);
      pcVar4 = strnodetype(leafref_target->nodetype);
      ly_vlog(LYE_SPEC,LY_VLOG_LYS,leafref,"The leafref %s is config but refers to a non-config %s."
              ,pcVar3,pcVar4);
      return -1;
    }
    plVar1 = leafref_target;
    if (leafref_target != (lys_node_leaf *)0x0) {
      do {
        if ((plVar1->type).base != LY_TYPE_LEAFREF) break;
        if (plVar1 == (lys_node_leaf *)leafref) {
          ly_vlog(LYE_CIRC_LEAFREFS,LY_VLOG_LYS,leafref);
          goto LAB_0015a794;
        }
        plVar1 = (plVar1->type).info.lref.target;
      } while (plVar1 != (lys_node_leaf *)0x0);
    }
    if (leafref_target->backlinks == (ly_set *)0x0) {
      plVar2 = ly_set_new();
      leafref_target->backlinks = plVar2;
      if (plVar2 == (ly_set *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_leaf_add_leafref_target");
        goto LAB_0015a794;
      }
    }
    iVar6 = 0;
    ly_set_add(leafref_target->backlinks,leafref,0);
  }
  return iVar6;
}

Assistant:

int
lys_leaf_add_leafref_target(struct lys_node_leaf *leafref_target, struct lys_node *leafref)
{
    struct lys_node_leaf *iter = leafref_target;

    if (!(leafref_target->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGINT;
        return -1;
    }

    /* check for config flag */
    if (((struct lys_node_leaf*)leafref)->type.info.lref.req != -1 &&
            (leafref->flags & LYS_CONFIG_W) && (leafref_target->flags & LYS_CONFIG_R)) {
        LOGVAL(LYE_SPEC, LY_VLOG_LYS, leafref,
               "The leafref %s is config but refers to a non-config %s.",
               strnodetype(leafref->nodetype), strnodetype(leafref_target->nodetype));
        return -1;
    }
    /* check for cycles */
    while (iter && iter->type.base == LY_TYPE_LEAFREF) {
        if ((void *)iter == (void *)leafref) {
            /* cycle detected */
            LOGVAL(LYE_CIRC_LEAFREFS, LY_VLOG_LYS, leafref);
            return -1;
        }
        iter = iter->type.info.lref.target;
    }

    /* create fake child - the ly_set structure to hold the list of
     * leafrefs referencing the leaf(-list) */
    if (!leafref_target->backlinks) {
        leafref_target->backlinks = (void*)ly_set_new();
        if (!leafref_target->backlinks) {
            LOGMEM;
            return -1;
        }
    }
    ly_set_add(leafref_target->backlinks, leafref, 0);

    return 0;
}